

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

uint AttributeVersions(Node *node,AttVal *attval)

{
  int iVar1;
  uint local_24;
  uint i;
  AttVal *attval_local;
  Node *node_local;
  
  if (((attval == (AttVal *)0x0) || (attval->attribute == (tmbstr)0x0)) ||
     (iVar1 = prvTidytmbstrncmp(attval->attribute,"data-",5), iVar1 != 0)) {
    if ((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) {
      node_local._4_4_ = 0;
    }
    else {
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
         (node->tag->attrvers != (AttrVersion *)0x0)) {
        local_24 = 0;
        while (node->tag->attrvers[local_24].attribute != TidyAttr_UNKNOWN) {
          if (node->tag->attrvers[local_24].attribute == attval->dict->id) {
            return node->tag->attrvers[local_24].versions;
          }
          local_24 = local_24 + 1;
        }
      }
      node_local._4_4_ = 0xe000;
    }
  }
  else {
    node_local._4_4_ = 0x60000;
  }
  return node_local._4_4_;
}

Assistant:

static uint AttributeVersions(Node* node, AttVal* attval)
{
    uint i;

    /* Override or add to items in attrdict.c */
    if (attval && attval->attribute) {
        /* HTML5 data-* attributes can't be added generically; handle here. */
        if (TY_(tmbstrncmp)(attval->attribute, "data-", 5) == 0)
            return (XH50 | HT50);
    }
    /* TODO: maybe this should return VERS_PROPRIETARY instead? */
    if (!attval || !attval->dict)
        return VERS_UNKNOWN;

    if (!(!node || !node->tag || !node->tag->attrvers))
        for (i = 0; node->tag->attrvers[i].attribute; ++i)
            if (node->tag->attrvers[i].attribute == attval->dict->id)
                return node->tag->attrvers[i].versions;

    return VERS_PROPRIETARY;
}